

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

bool __thiscall QAuthenticator::operator==(QAuthenticator *this,QAuthenticator *other)

{
  QAuthenticatorPrivate *s1;
  QAuthenticatorPrivate *s2;
  bool bVar1;
  
  s1 = this->d;
  s2 = other->d;
  if (s1 == s2) {
    bVar1 = true;
  }
  else {
    if (s2 != (QAuthenticatorPrivate *)0x0 && s1 != (QAuthenticatorPrivate *)0x0) {
      bVar1 = comparesEqual(&s1->user,&s2->user);
      if (bVar1) {
        bVar1 = comparesEqual(&this->d->password,&other->d->password);
        if (bVar1) {
          bVar1 = comparesEqual(&this->d->realm,&other->d->realm);
          if (bVar1) {
            if (this->d->method == other->d->method) {
              bVar1 = comparesEqual<QString,_QVariant,_true>(&this->d->options,&other->d->options);
              return bVar1;
            }
          }
        }
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool QAuthenticator::operator==(const QAuthenticator &other) const
{
    if (d == other.d)
        return true;
    if (!d || !other.d)
        return false;
    return d->user == other.d->user
        && d->password == other.d->password
        && d->realm == other.d->realm
        && d->method == other.d->method
        && d->options == other.d->options;
}